

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

int leveldb::anon_unknown_1::LockOrUnlock(int fd,bool lock)

{
  int iVar1;
  int *piVar2;
  byte in_SIL;
  int in_EDI;
  long in_FS_OFFSET;
  flock file_lock_info;
  ulong local_28 [5];
  
  local_28[4] = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = __errno_location();
  *piVar2 = 0;
  local_28[3] = 0;
  local_28[0] = (ulong)(ushort)(2 - (in_SIL & 1));
  local_28[1] = 0;
  local_28[2] = 0;
  iVar1 = fcntl(in_EDI,6,local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28[4]) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int LockOrUnlock(int fd, bool lock) {
  errno = 0;
  struct ::flock file_lock_info;
  std::memset(&file_lock_info, 0, sizeof(file_lock_info));
  file_lock_info.l_type = (lock ? F_WRLCK : F_UNLCK);
  file_lock_info.l_whence = SEEK_SET;
  file_lock_info.l_start = 0;
  file_lock_info.l_len = 0;  // Lock/unlock entire file.
  return ::fcntl(fd, F_SETLK, &file_lock_info);
}